

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  ulong uVar1;
  uchar uVar2;
  ushort uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  ImFont *pIVar8;
  StbUndoRecord *pSVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  short sVar12;
  int temp;
  int iVar13;
  int iVar14;
  uint uVar15;
  ImWchar *pIVar16;
  unsigned_short *puVar17;
  int n_2;
  uint uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ImGuiStb *pIVar22;
  long lVar23;
  int n_1;
  uint uVar24;
  int iVar25;
  ImGuiInputTextState *str;
  int *piVar26;
  ulong uVar27;
  int iVar28;
  undefined8 in_R8;
  float *pfVar29;
  uint uVar30;
  uint uVar31;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  ImWchar *text_remaining;
  StbFindState find;
  ImWchar *local_50;
  ImWchar local_48 [6];
  int local_3c;
  int local_38;
  int local_34;
  
  state = &this->StbState;
  uVar2 = (this->StbState).single_line;
LAB_00149309:
  switch(key) {
  case 0x10000:
    goto switchD_0014931c_caseD_10000;
  case 0x10001:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      (this->StbState).cursor = (this->StbState).cursor + 1;
      iVar14 = this->CurLenW;
    }
    else {
      ImGuiStb::stb_textedit_move_to_last(this,state);
      iVar14 = this->CurLenW;
      iVar19 = (this->StbState).select_start;
      iVar28 = (this->StbState).select_end;
      if (iVar19 != iVar28) {
        if (iVar14 < iVar19) {
          (this->StbState).select_start = iVar14;
          iVar19 = iVar14;
        }
        if (iVar14 < iVar28) {
          (this->StbState).select_end = iVar14;
          iVar28 = iVar14;
        }
        if (iVar19 == iVar28) {
          state->cursor = iVar19;
        }
      }
    }
    if (iVar14 < state->cursor) goto LAB_00149a31;
    goto LAB_0014a06f;
  case 0x10002:
switchD_0014931c_caseD_10002:
    if (uVar2 == '\0') {
      uVar15 = (this->StbState).select_start;
      str = (ImGuiInputTextState *)(ulong)uVar15;
      uVar31 = (this->StbState).select_end;
      if ((key & 0x20000U) == 0) {
        if (uVar15 == uVar31) {
          str = (ImGuiInputTextState *)(ulong)(uint)state->cursor;
        }
        else {
          if ((int)uVar31 < (int)uVar15) {
            (this->StbState).select_start = uVar31;
            str = (ImGuiInputTextState *)(ulong)uVar31;
          }
          (this->StbState).cursor = (int)str;
          (this->StbState).select_end = (int)str;
          (this->StbState).has_preferred_x = '\0';
        }
LAB_00149ba1:
        uVar30 = this->CurLenW;
      }
      else {
        if (uVar15 == uVar31) {
          uVar15 = (this->StbState).cursor;
          str = (ImGuiInputTextState *)(ulong)uVar15;
          (this->StbState).select_end = uVar15;
          (this->StbState).select_start = uVar15;
          goto LAB_00149ba1;
        }
        (this->StbState).cursor = uVar31;
        uVar30 = this->CurLenW;
        if ((int)uVar30 < (int)uVar15) {
          (this->StbState).select_start = uVar30;
          str = (ImGuiInputTextState *)(ulong)uVar30;
        }
        uVar15 = uVar31;
        if ((int)uVar30 < (int)uVar31) {
          (this->StbState).select_end = uVar30;
          uVar15 = uVar30;
        }
        if ((uint)str == uVar15) {
          state->cursor = (uint)str;
        }
        else {
          str = (ImGuiInputTextState *)(ulong)uVar31;
        }
      }
      if ((int)uVar30 < (int)str) {
        state->cursor = uVar30;
        str = (ImGuiInputTextState *)(ulong)uVar30;
      }
      ImGuiStb::stb_textedit_find_charpos
                ((ImGuiStb *)local_48,(StbFindState *)this,str,0,(int)in_R8);
      if (local_34 == local_3c) goto LAB_0014a073;
      pIVar22 = (ImGuiStb *)&(this->StbState).preferred_x;
      if ((this->StbState).has_preferred_x == '\0') {
        pIVar22 = (ImGuiStb *)local_48;
      }
      fVar35 = *(float *)pIVar22;
      (this->StbState).cursor = local_34;
      puVar17 = (this->TextW).Data;
      local_50 = (ImWchar *)0x0;
      pIVar16 = puVar17 + local_34;
      InputTextCalcTextSizeW(pIVar16,puVar17 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0))
      ;
      pIVar10 = GImGui;
      uVar15 = (uint)((ulong)((long)local_50 - (long)pIVar16) >> 1);
      if ((int)uVar15 < 1) goto LAB_00149caf;
      puVar17 = (this->TextW).Data;
      iVar14 = (this->StbState).cursor;
      fVar33 = 0.0;
      uVar27 = 0;
      goto LAB_00149c56;
    }
    key = key & 0x20000U | 0x10000;
    goto LAB_00149309;
  case 0x10003:
switchD_0014931c_caseD_10003:
    if (uVar2 != '\0') goto code_r0x0014935a;
    uVar15 = (this->StbState).select_start;
    uVar31 = (this->StbState).select_end;
    if ((key & 0x20000U) == 0) {
      if (uVar15 == uVar31) goto LAB_00149829;
      ImGuiStb::stb_textedit_move_to_last(this,state);
      uVar15 = (this->StbState).select_start;
      uVar31 = (this->StbState).select_end;
LAB_00149a4c:
      uVar30 = this->CurLenW;
      if (uVar15 != uVar31) {
        if ((int)uVar30 < (int)uVar15) {
          (this->StbState).select_start = uVar30;
          uVar15 = uVar30;
        }
        if ((int)uVar30 < (int)uVar31) {
          (this->StbState).select_end = uVar30;
          uVar31 = uVar30;
        }
        if (uVar15 == uVar31) {
          state->cursor = uVar15;
        }
      }
    }
    else {
      if (uVar15 != uVar31) {
        state->cursor = uVar31;
        goto LAB_00149a4c;
      }
      iVar14 = (this->StbState).cursor;
      (this->StbState).select_end = iVar14;
      (this->StbState).select_start = iVar14;
LAB_00149829:
      uVar30 = this->CurLenW;
    }
    uVar15 = state->cursor;
    if ((int)uVar30 < state->cursor) {
      state->cursor = uVar30;
      uVar15 = uVar30;
    }
    ImGuiStb::stb_textedit_find_charpos
              ((ImGuiStb *)local_48,(StbFindState *)this,(ImGuiInputTextState *)(ulong)uVar15,
               (uint)(this->StbState).single_line,(int)in_R8);
    if ((long)local_38 == 0) goto LAB_0014a073;
    pIVar22 = (ImGuiStb *)&(this->StbState).preferred_x;
    if ((this->StbState).has_preferred_x == '\0') {
      pIVar22 = (ImGuiStb *)local_48;
    }
    fVar35 = *(float *)pIVar22;
    lVar21 = (long)local_3c + (long)local_38;
    (this->StbState).cursor = (int)lVar21;
    puVar17 = (this->TextW).Data;
    local_50 = (ImWchar *)0x0;
    pIVar16 = puVar17 + lVar21;
    InputTextCalcTextSizeW(pIVar16,puVar17 + this->CurLenW,&local_50,(ImVec2 *)0x1,SUB81(in_R8,0));
    pIVar10 = GImGui;
    uVar15 = (uint)((ulong)((long)local_50 - (long)pIVar16) >> 1);
    if ((int)uVar15 < 1) goto LAB_00149caf;
    puVar17 = (this->TextW).Data;
    iVar14 = (this->StbState).cursor;
    fVar33 = 0.0;
    uVar27 = 0;
    goto LAB_00149b26;
  case 0x10004:
    uVar15 = this->CurLenW;
    uVar31 = (this->StbState).select_start;
    uVar30 = (this->StbState).select_end;
    uVar18 = uVar31;
    if (uVar31 != uVar30) {
      if ((int)uVar15 < (int)uVar31) {
        (this->StbState).select_start = uVar15;
        uVar31 = uVar15;
      }
      if ((int)uVar15 < (int)uVar30) {
        (this->StbState).select_end = uVar15;
        uVar30 = uVar15;
      }
      uVar18 = uVar30;
      if (uVar31 == uVar30) {
        state->cursor = uVar31;
        uVar18 = uVar31;
      }
    }
    uVar30 = state->cursor;
    if ((int)uVar15 < state->cursor) {
      state->cursor = uVar15;
      uVar30 = uVar15;
    }
    if (uVar31 != uVar18) {
      uVar30 = uVar31;
      if ((int)uVar18 < (int)uVar31) {
        (this->StbState).select_start = uVar18;
        uVar30 = uVar18;
      }
      (this->StbState).cursor = uVar30;
      (this->StbState).select_end = uVar30;
    }
    if (uVar2 != '\0') {
      state->cursor = 0;
      goto LAB_0014a06f;
    }
    if ((int)uVar30 < 1) goto LAB_0014a06f;
    puVar17 = (this->TextW).Data;
    uVar27 = (ulong)uVar30;
    goto LAB_00149d8b;
  case 0x10005:
    iVar14 = this->CurLenW;
    iVar19 = (this->StbState).select_start;
    iVar28 = (this->StbState).select_end;
    iVar25 = iVar19;
    if (iVar19 != iVar28) {
      if (iVar14 < iVar19) {
        (this->StbState).select_start = iVar14;
        iVar19 = iVar14;
      }
      if (iVar14 < iVar28) {
        (this->StbState).select_end = iVar14;
        iVar28 = iVar14;
      }
      iVar25 = iVar28;
      if (iVar19 == iVar28) {
        state->cursor = iVar19;
        iVar25 = iVar19;
      }
    }
    iVar28 = state->cursor;
    if (iVar14 < state->cursor) {
      state->cursor = iVar14;
      iVar28 = iVar14;
    }
    if (iVar19 != iVar25) {
      iVar28 = iVar19;
      if (iVar25 < iVar19) {
        (this->StbState).select_start = iVar25;
        iVar28 = iVar25;
      }
      (this->StbState).cursor = iVar28;
      (this->StbState).select_end = iVar28;
    }
    if (uVar2 != '\0') {
      state->cursor = iVar14;
      goto LAB_0014a06f;
    }
    if (iVar14 <= iVar28) goto LAB_0014a06f;
    puVar17 = (this->TextW).Data + iVar28;
    goto LAB_00149dc8;
  case 0x10006:
    (this->StbState).select_end = 0;
    (this->StbState).cursor = 0;
    (this->StbState).select_start = 0;
    goto LAB_0014a06f;
  case 0x10007:
    (this->StbState).cursor = this->CurLenW;
    (this->StbState).select_start = 0;
    (this->StbState).select_end = 0;
    goto LAB_0014a06f;
  case 0x10008:
switchD_0014931c_caseD_10008:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar14 = (this->StbState).cursor;
      if (iVar14 < this->CurLenW) {
        ImGuiStb::stb_textedit_delete(this,state,iVar14,1);
      }
      goto LAB_0014a06f;
    }
    break;
  case 0x10009:
switchD_0014931c_caseD_10009:
    if ((this->StbState).select_start == (this->StbState).select_end) {
      iVar14 = this->CurLenW;
      iVar19 = (this->StbState).cursor;
      if (iVar14 < iVar19) {
        state->cursor = iVar14;
        iVar19 = iVar14;
      }
      if (0 < iVar19) {
        ImGuiStb::stb_textedit_delete(this,state,iVar19 + -1,1);
        (this->StbState).cursor = (this->StbState).cursor + -1;
      }
      goto LAB_0014a06f;
    }
    break;
  case 0x1000a:
    lVar21 = (long)(this->StbState).undostate.undo_point;
    if (lVar21 == 0) goto LAB_0014a06f;
    iVar14 = (this->StbState).undostate.undo_rec[lVar21 + -1].where;
    iVar19 = (this->StbState).undostate.undo_rec[lVar21 + -1].insert_length;
    uVar15 = (this->StbState).undostate.undo_rec[lVar21 + -1].delete_length;
    uVar27 = (ulong)(this->StbState).undostate.redo_point;
    iVar28 = (this->StbState).undostate.undo_rec[lVar21 + -1].char_storage;
    (this->StbState).undostate.undo_rec[uVar27 - 1].char_storage = -1;
    (this->StbState).undostate.undo_rec[uVar27 - 1].insert_length = uVar15;
    (this->StbState).undostate.undo_rec[uVar27 - 1].delete_length = iVar19;
    (this->StbState).undostate.undo_rec[uVar27 - 1].where = iVar14;
    if ((ulong)uVar15 == 0) goto LAB_00149faa;
    iVar25 = (this->StbState).undostate.undo_char_point;
    if ((int)(iVar25 + uVar15) < 999) {
      iVar20 = (this->StbState).undostate.redo_char_point;
      if (iVar20 < (int)(iVar25 + uVar15)) goto LAB_00149e78;
      goto LAB_00149f4c;
    }
    (this->StbState).undostate.undo_rec[uVar27 - 1].insert_length = 0;
    goto LAB_00149f98;
  case 0x1000b:
    lVar21 = (long)(this->StbState).undostate.redo_point;
    if (lVar21 != 99) {
      sVar12 = (this->StbState).undostate.undo_point;
      iVar14 = (this->StbState).undostate.undo_rec[lVar21].where;
      iVar19 = (this->StbState).undostate.undo_rec[lVar21].insert_length;
      uVar15 = (this->StbState).undostate.undo_rec[lVar21].delete_length;
      iVar28 = (this->StbState).undostate.undo_rec[lVar21].char_storage;
      (this->StbState).undostate.undo_rec[sVar12].delete_length = iVar19;
      (this->StbState).undostate.undo_rec[sVar12].insert_length = uVar15;
      (this->StbState).undostate.undo_rec[sVar12].where = iVar14;
      (this->StbState).undostate.undo_rec[sVar12].char_storage = -1;
      if ((ulong)uVar15 != 0) {
        iVar25 = (this->StbState).undostate.undo_char_point;
        if ((this->StbState).undostate.redo_char_point < (int)(iVar25 + uVar15)) {
          pSVar9 = (this->StbState).undostate.undo_rec + sVar12;
          pSVar9->insert_length = 0;
          pSVar9->delete_length = 0;
        }
        else {
          (this->StbState).undostate.undo_rec[sVar12].char_storage = iVar25;
          (this->StbState).undostate.undo_char_point = iVar25 + uVar15;
          if (0 < (int)uVar15) {
            puVar17 = (this->TextW).Data;
            uVar27 = 0;
            do {
              (this->StbState).undostate.undo_char[(long)iVar25 + uVar27] =
                   puVar17[(long)iVar14 + uVar27];
              uVar27 = uVar27 + 1;
            } while (uVar15 != uVar27);
          }
        }
        ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar15);
      }
      if (iVar19 != 0) {
        ImGuiStb::STB_TEXTEDIT_INSERTCHARS
                  (this,iVar14,(this->StbState).undostate.undo_char + iVar28,iVar19);
        piVar26 = &(this->StbState).undostate.redo_char_point;
        *piVar26 = *piVar26 + iVar19;
      }
      (this->StbState).cursor = iVar19 + iVar14;
      uVar5 = (this->StbState).undostate.undo_point;
      uVar7 = (this->StbState).undostate.redo_point;
      (this->StbState).undostate.undo_point = uVar5 + 1;
      (this->StbState).undostate.redo_point = uVar7 + 1;
    }
    goto LAB_0014a06f;
  case 0x1000c:
    iVar14 = (this->StbState).select_start;
    iVar19 = (this->StbState).select_end;
    bVar32 = SBORROW4(iVar14,iVar19);
    iVar28 = iVar14 - iVar19;
    bVar11 = iVar14 == iVar19;
    if (!bVar11) goto LAB_0014960a;
    uVar15 = state->cursor;
    uVar31 = (int)uVar15 >> 0x1f & uVar15;
    goto LAB_001495ba;
  case 0x1000d:
    if ((this->StbState).select_start != (this->StbState).select_end) {
      ImGuiStb::stb_textedit_move_to_last(this,state);
      goto LAB_0014a073;
    }
    uVar15 = ImGuiStb::STB_TEXTEDIT_MOVEWORDRIGHT_IMPL(this,(this->StbState).cursor);
    goto LAB_00149df8;
  default:
    switch(key) {
    case 0x30000:
      iVar14 = this->CurLenW;
      iVar28 = (this->StbState).select_start;
      iVar19 = (this->StbState).select_end;
      if (iVar28 == iVar19) {
        iVar28 = state->cursor;
LAB_001499c2:
        iVar19 = iVar14;
        if (iVar28 < iVar14) {
          iVar19 = iVar28;
        }
        (this->StbState).select_end = iVar19;
        (this->StbState).select_start = iVar19;
      }
      else {
        if (iVar14 < iVar28) {
          (this->StbState).select_start = iVar14;
          iVar28 = iVar14;
        }
        if (iVar14 < iVar19) {
          (this->StbState).select_end = iVar14;
          iVar19 = iVar14;
        }
        if (iVar28 == iVar19) goto LAB_001499c2;
      }
      if (0 < iVar19) {
        iVar19 = iVar19 + -1;
        (this->StbState).select_end = iVar19;
      }
      (this->StbState).cursor = iVar19;
      goto LAB_0014a06f;
    case 0x30001:
      iVar14 = (this->StbState).select_start;
      iVar19 = (this->StbState).select_end;
      if (iVar14 == iVar19) {
        iVar14 = (this->StbState).cursor;
        (this->StbState).select_start = iVar14;
        iVar19 = iVar14;
      }
      iVar28 = iVar19 + 1;
      (this->StbState).select_end = iVar28;
      if (iVar14 != iVar28) {
        iVar25 = this->CurLenW;
        if (iVar25 < iVar14) {
          (this->StbState).select_start = iVar25;
        }
        iVar14 = iVar28;
        if (iVar25 <= iVar19) {
          (this->StbState).select_end = iVar25;
          iVar14 = iVar25;
        }
      }
      (this->StbState).cursor = iVar14;
      goto LAB_0014a06f;
    case 0x30002:
      goto switchD_0014931c_caseD_10002;
    case 0x30003:
      goto switchD_0014931c_caseD_10003;
    case 0x30004:
      uVar15 = this->CurLenW;
      uVar31 = (this->StbState).select_start;
      uVar30 = (this->StbState).select_end;
      uVar18 = uVar31;
      if (uVar31 != uVar30) {
        if ((int)uVar15 < (int)uVar31) {
          (this->StbState).select_start = uVar15;
          uVar31 = uVar15;
        }
        if ((int)uVar15 < (int)uVar30) {
          (this->StbState).select_end = uVar15;
          uVar30 = uVar15;
        }
        uVar18 = uVar30;
        if (uVar31 == uVar30) {
          state->cursor = uVar31;
          uVar18 = uVar31;
        }
      }
      uVar30 = state->cursor;
      if ((int)uVar15 < state->cursor) {
        state->cursor = uVar15;
        uVar30 = uVar15;
      }
      if (uVar31 == uVar18) {
        (this->StbState).select_start = uVar30;
        uVar18 = uVar30;
      }
      else {
        state->cursor = uVar18;
      }
      uVar15 = 0;
      if (uVar2 != '\0') goto LAB_00149984;
      if ((int)uVar18 < 1) goto LAB_00149989;
      puVar17 = (this->TextW).Data;
      uVar27 = (ulong)uVar18;
      if (puVar17[(ulong)uVar18 - 1] == 10) goto LAB_00149989;
      goto LAB_00149d3f;
    case 0x30005:
      iVar14 = this->CurLenW;
      iVar19 = (this->StbState).select_start;
      iVar28 = (this->StbState).select_end;
      iVar25 = iVar19;
      if (iVar19 != iVar28) {
        if (iVar14 < iVar19) {
          (this->StbState).select_start = iVar14;
          iVar19 = iVar14;
        }
        if (iVar14 < iVar28) {
          (this->StbState).select_end = iVar14;
          iVar28 = iVar14;
        }
        iVar25 = iVar28;
        if (iVar19 == iVar28) {
          state->cursor = iVar19;
          iVar25 = iVar19;
        }
      }
      iVar28 = state->cursor;
      if (iVar14 < state->cursor) {
        state->cursor = iVar14;
        iVar28 = iVar14;
      }
      if (iVar19 == iVar25) {
        (this->StbState).select_start = iVar28;
        iVar25 = iVar28;
      }
      else {
        state->cursor = iVar25;
      }
      iVar19 = iVar14;
      if (uVar2 != '\0') goto LAB_001499ef;
      if (iVar14 <= iVar25) goto LAB_00149d75;
      puVar17 = (this->TextW).Data;
      if (puVar17[iVar25] == 10) goto LAB_00149d75;
      puVar17 = puVar17 + iVar25;
      goto LAB_0014a09e;
    case 0x30006:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        (this->StbState).select_start = (this->StbState).cursor;
      }
      iVar14 = 0;
      break;
    case 0x30007:
      if ((this->StbState).select_start == (this->StbState).select_end) {
        (this->StbState).select_start = (this->StbState).cursor;
      }
      iVar14 = this->CurLenW;
      break;
    case 0x30008:
      goto switchD_0014931c_caseD_10008;
    case 0x30009:
      goto switchD_0014931c_caseD_10009;
    default:
      uVar15 = 0;
      if (key < 0x10000) {
        uVar15 = key;
      }
      if (((int)uVar15 < 1) || (local_48[0] = (ImWchar)uVar15, uVar15 == 10 && uVar2 != '\0'))
      goto LAB_0014a073;
      if (((this->StbState).insert_mode == '\0') ||
         ((this->StbState).select_start != (this->StbState).select_end)) {
LAB_00149e12:
        ImGuiStb::stb_textedit_delete_selection(this,state);
        bVar11 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_48,1);
        if (!bVar11) goto LAB_0014a073;
        ImGuiStb::stb_text_createundo(&(this->StbState).undostate,(this->StbState).cursor,0,1);
      }
      else {
        iVar14 = (this->StbState).cursor;
        if (this->CurLenW <= iVar14) goto LAB_00149e12;
        pIVar16 = ImGuiStb::stb_text_createundo(&(this->StbState).undostate,iVar14,1,1);
        if (pIVar16 != (ImWchar *)0x0) {
          *pIVar16 = (this->TextW).Data[iVar14];
        }
        ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,(this->StbState).cursor,1);
        bVar11 = ImGuiStb::STB_TEXTEDIT_INSERTCHARS(this,(this->StbState).cursor,local_48,1);
        if (!bVar11) goto LAB_0014a073;
      }
      (this->StbState).cursor = (this->StbState).cursor + 1;
      goto LAB_0014a06f;
    case 0x3000c:
      uVar15 = (this->StbState).cursor;
      uVar31 = (this->StbState).select_start;
      if (uVar31 == (this->StbState).select_end) {
        (this->StbState).select_end = uVar15;
        (this->StbState).select_start = uVar15;
        uVar31 = uVar15;
      }
      uVar30 = (int)uVar15 >> 0x1f & uVar15;
      goto LAB_001494c5;
    case 0x3000d:
      iVar14 = (this->StbState).cursor;
      iVar19 = (this->StbState).select_start;
      if (iVar19 == (this->StbState).select_end) {
        (this->StbState).select_end = iVar14;
        (this->StbState).select_start = iVar14;
        iVar19 = iVar14;
      }
      iVar28 = this->CurLenW;
      iVar25 = iVar14 + 1;
      if (iVar14 + 1 < iVar28) {
        iVar25 = iVar28;
      }
      goto LAB_0014953c;
    }
    (this->StbState).select_end = iVar14;
    (this->StbState).cursor = iVar14;
    goto LAB_0014a06f;
  }
  ImGuiStb::stb_textedit_delete_selection(this,state);
  goto LAB_0014a06f;
  while (iVar13 = ImGuiStb::is_word_boundary_from_right(this,iVar14), iVar20 = iVar14, iVar13 == 0)
  {
LAB_0014953c:
    iVar14 = iVar14 + 1;
    iVar20 = iVar25;
    if (iVar28 <= iVar14) break;
  }
  if (iVar28 <= iVar20) {
    iVar20 = iVar28;
  }
  (this->StbState).cursor = iVar20;
  (this->StbState).select_end = iVar20;
  if (iVar19 != iVar20) {
    if (iVar28 < iVar19) {
      (this->StbState).select_start = iVar28;
      iVar19 = iVar28;
    }
    if (iVar19 == iVar20) {
      state->cursor = iVar20;
    }
  }
  goto LAB_0014a073;
  while( true ) {
    uVar15 = uVar15 - 1;
    iVar14 = ImGuiStb::is_word_boundary_from_right(this,uVar15);
    uVar18 = uVar15;
    if (iVar14 != 0) break;
LAB_001494c5:
    uVar18 = uVar30 - 1;
    if ((int)uVar15 < 1) break;
  }
  uVar15 = 0;
  if (0 < (int)uVar18) {
    uVar15 = uVar18;
  }
  (this->StbState).cursor = uVar15;
  (this->StbState).select_end = uVar15;
  uVar30 = this->CurLenW;
  if (uVar31 != uVar15) {
    uVar18 = uVar31;
    if ((int)uVar30 < (int)uVar31) {
      (this->StbState).select_start = uVar30;
      uVar18 = uVar30;
    }
    uVar24 = uVar15;
    if ((int)uVar30 < (int)uVar15) {
      (this->StbState).select_end = uVar30;
      uVar24 = uVar30;
    }
    uVar31 = uVar15;
    if (uVar18 == uVar24) {
      state->cursor = uVar18;
      uVar31 = uVar18;
    }
  }
  if ((int)uVar30 < (int)uVar31) {
    state->cursor = uVar30;
  }
  goto LAB_0014a073;
  while (iVar25 = iVar25 + 1, iVar19 = iVar25, *puVar17 != 10) {
LAB_0014a09e:
    puVar17 = puVar17 + 1;
    iVar19 = iVar14;
    if (iVar14 + -1 == iVar25) break;
  }
LAB_001499ef:
  iVar25 = iVar19;
  state->cursor = iVar25;
LAB_00149d75:
  (this->StbState).select_end = iVar25;
  goto LAB_0014a06f;
  while (uVar1 = uVar27 - 1, lVar21 = uVar27 - 2, uVar27 = uVar1, puVar17[lVar21] != 10) {
LAB_00149d3f:
    if (uVar27 < 2) goto LAB_00149984;
  }
  uVar15 = (uint)uVar1;
LAB_00149984:
  uVar18 = uVar15;
  state->cursor = uVar18;
LAB_00149989:
  (this->StbState).select_end = uVar18;
  goto LAB_0014a06f;
  while( true ) {
    uVar15 = uVar15 - 1;
    iVar14 = ImGuiStb::is_word_boundary_from_right(this,uVar15);
    uVar30 = uVar15;
    if (iVar14 != 0) break;
LAB_001495ba:
    uVar30 = uVar31 - 1;
    if ((int)uVar15 < 1) break;
  }
  uVar15 = 0;
  if (0 < (int)uVar30) {
    uVar15 = uVar30;
  }
LAB_00149df8:
  (this->StbState).cursor = uVar15;
  ImGuiStb::stb_textedit_clamp((ImGuiInputTextState *)(ulong)(uint)this->CurLenW,state);
  goto LAB_0014a073;
  while( true ) {
    if (sVar12 < 99) {
      if (-1 < (this->StbState).undostate.undo_rec[0x62].char_storage) {
        iVar25 = (this->StbState).undostate.undo_rec[0x62].insert_length;
        iVar20 = iVar20 + iVar25;
        (this->StbState).undostate.redo_char_point = iVar20;
        pIVar16 = (this->StbState).undostate.undo_char + iVar20;
        memmove(pIVar16,pIVar16 + -(long)iVar25,(long)(999 - iVar20) * 2);
        sVar12 = (this->StbState).undostate.redo_point;
        lVar21 = (long)sVar12;
        if (lVar21 < 0x62) {
          lVar23 = lVar21 + -0x62;
          piVar26 = &(this->StbState).undostate.undo_rec[lVar21].char_storage;
          do {
            if (-1 < *piVar26) {
              *piVar26 = *piVar26 + iVar25;
            }
            piVar26 = piVar26 + 4;
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0);
        }
      }
      lVar21 = (long)sVar12;
      memmove((this->StbState).undostate.undo_rec + lVar21 + 1,
              (this->StbState).undostate.undo_rec + lVar21,lVar21 * -0x10 + 0x630);
      iVar25 = (this->StbState).undostate.undo_char_point;
      uVar31 = *(int *)&(this->StbState).undostate.redo_point + 1;
      uVar27 = (ulong)uVar31;
      (this->StbState).undostate.redo_point = (short)uVar31;
      iVar20 = (this->StbState).undostate.redo_char_point;
    }
    if ((int)(uVar15 + iVar25) <= iVar20) break;
LAB_00149e78:
    sVar12 = (short)uVar27;
    if (sVar12 == 99) goto LAB_0014a06f;
  }
  uVar27 = (ulong)(short)uVar27;
LAB_00149f4c:
  (this->StbState).undostate.undo_rec[uVar27 - 1].char_storage = iVar20 - uVar15;
  (this->StbState).undostate.redo_char_point = iVar20 - uVar15;
  if (0 < (int)uVar15) {
    puVar17 = (this->TextW).Data;
    uVar27 = 0;
    do {
      *(unsigned_short *)
       ((long)this + uVar27 * 2 + (long)iVar20 * 2 + (long)(int)uVar15 * -2 + 0x690) =
           puVar17[(long)iVar14 + uVar27];
      uVar27 = uVar27 + 1;
    } while (uVar15 != uVar27);
  }
LAB_00149f98:
  ImGuiStb::STB_TEXTEDIT_DELETECHARS(this,iVar14,uVar15);
LAB_00149faa:
  if (iVar19 != 0) {
    ImGuiStb::STB_TEXTEDIT_INSERTCHARS
              (this,iVar14,(this->StbState).undostate.undo_char + iVar28,iVar19);
    piVar26 = &(this->StbState).undostate.undo_char_point;
    *piVar26 = *piVar26 - iVar19;
  }
  (this->StbState).cursor = iVar19 + iVar14;
  uVar4 = (this->StbState).undostate.undo_point;
  uVar6 = (this->StbState).undostate.redo_point;
  (this->StbState).undostate.undo_point = uVar4 + -1;
  (this->StbState).undostate.redo_point = uVar6 + -1;
  goto LAB_0014a06f;
  while( true ) {
    state->cursor = iVar28;
    puVar17 = puVar17 + 1;
    if (iVar28 == iVar14) break;
LAB_00149dc8:
    iVar28 = iVar28 + 1;
    if (*puVar17 == 10) break;
  }
  goto LAB_0014a06f;
code_r0x0014935a:
  key = key & 0x20000U | 0x10001;
  goto LAB_00149309;
LAB_00149b26:
  uVar3 = puVar17[lVar21 + uVar27];
  if (uVar3 == 10) goto LAB_00149caf;
  pIVar8 = pIVar10->Font;
  pfVar29 = &pIVar8->FallbackAdvanceX;
  if ((int)(uint)uVar3 < (pIVar8->IndexAdvanceX).Size) {
    pfVar29 = (float *)((ulong)((uint)uVar3 * 4) + (long)(pIVar8->IndexAdvanceX).Data);
  }
  fVar34 = (pIVar10->FontSize / pIVar8->FontSize) * *pfVar29;
  if (((fVar34 == -1.0) && (!NAN(fVar34))) || (fVar33 = fVar33 + fVar34, fVar35 < fVar33))
  goto LAB_00149caf;
  state->cursor = iVar14 + 1 + (int)uVar27;
  uVar27 = uVar27 + 1;
  if ((uVar15 & 0x7fffffff) == uVar27) goto LAB_00149caf;
  goto LAB_00149b26;
LAB_00149c56:
  uVar3 = puVar17[(long)local_34 + uVar27];
  if (uVar3 == 10) goto LAB_00149caf;
  pIVar8 = pIVar10->Font;
  pfVar29 = &pIVar8->FallbackAdvanceX;
  if ((int)(uint)uVar3 < (pIVar8->IndexAdvanceX).Size) {
    pfVar29 = (float *)((ulong)((uint)uVar3 * 4) + (long)(pIVar8->IndexAdvanceX).Data);
  }
  fVar34 = (pIVar10->FontSize / pIVar8->FontSize) * *pfVar29;
  if (((fVar34 == -1.0) && (!NAN(fVar34))) || (fVar33 = fVar33 + fVar34, fVar35 < fVar33))
  goto LAB_00149caf;
  state->cursor = iVar14 + 1 + (int)uVar27;
  uVar27 = uVar27 + 1;
  if ((uVar15 & 0x7fffffff) == uVar27) goto LAB_00149caf;
  goto LAB_00149c56;
LAB_00149caf:
  iVar14 = this->CurLenW;
  iVar19 = (this->StbState).select_start;
  iVar28 = (this->StbState).select_end;
  if (iVar19 != iVar28) {
    if (iVar14 < iVar19) {
      (this->StbState).select_start = iVar14;
      iVar19 = iVar14;
    }
    if (iVar14 < iVar28) {
      (this->StbState).select_end = iVar14;
      iVar28 = iVar14;
    }
    if (iVar19 == iVar28) {
      state->cursor = iVar19;
    }
  }
  iVar19 = state->cursor;
  if (iVar14 < state->cursor) {
    state->cursor = iVar14;
    iVar19 = iVar14;
  }
  (this->StbState).has_preferred_x = '\x01';
  (this->StbState).preferred_x = fVar35;
  if ((key & 0x20000U) != 0) {
    (this->StbState).select_end = iVar19;
  }
  goto LAB_0014a073;
switchD_0014931c_caseD_10000:
  iVar14 = (this->StbState).select_start;
  iVar19 = (this->StbState).select_end;
  bVar32 = SBORROW4(iVar14,iVar19);
  iVar28 = iVar14 - iVar19;
  bVar11 = iVar14 == iVar19;
  if (bVar11) {
    if (0 < state->cursor) {
      iVar14 = state->cursor + -1;
LAB_00149a31:
      state->cursor = iVar14;
    }
  }
  else {
LAB_0014960a:
    if (!bVar11 && bVar32 == iVar28 < 0) {
      (this->StbState).select_start = iVar19;
      iVar14 = iVar19;
    }
    (this->StbState).cursor = iVar14;
    (this->StbState).select_end = iVar14;
  }
  goto LAB_0014a06f;
  while( true ) {
    state->cursor = (int)uVar27 + -1;
    bVar11 = uVar27 < 2;
    uVar27 = uVar27 - 1;
    if (bVar11) break;
LAB_00149d8b:
    if (puVar17[uVar27 - 1] == 10) break;
  }
LAB_0014a06f:
  (this->StbState).has_preferred_x = '\0';
LAB_0014a073:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &StbState, key);
    CursorFollow = true;
    CursorAnimReset();
}